

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BFS.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  DecPOMDPDiscreteInterface *pDVar1;
  ostream *poVar2;
  size_t sVar3;
  int iVar4;
  PlanningUnitMADPDiscreteParameters params;
  tms ts_before;
  string filename;
  tms ts_after;
  char s [10];
  BruteForceSearchPlanner bfs;
  ofstream of;
  Arguments args;
  stringstream ss;
  PlanningUnitMADPDiscreteParameters local_9d9 [7];
  undefined1 local_9d2;
  double local_9d0;
  tms local_9c8;
  long local_9a8;
  shared_count sStack_9a0;
  long *local_998;
  long local_990;
  long local_988 [2];
  tms local_978;
  char local_94a [10];
  code *local_940;
  long local_938;
  long local_930;
  undefined4 local_928;
  undefined8 local_918;
  long local_608;
  shared_count sStack_600;
  double local_5f8;
  long *local_5f0;
  filebuf local_5e8 [8];
  long local_5e0 [2];
  byte abStack_5d0 [216];
  ios_base local_4f8 [264];
  Arguments local_3f0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ArgumentHandlers::Arguments::Arguments(&local_3f0);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&local_3f0);
  pDVar1 = (DecPOMDPDiscreteInterface *)
           ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&local_3f0);
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_5f0 = local_5e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"BFS","");
  directories::MADPGetResultsFilename
            ((string *)&local_940,(MultiAgentDecisionProcessInterface *)&local_5f0,
             (Arguments *)(pDVar1 + *(long *)(*(long *)pDVar1 + -0x40)));
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_940,local_938)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"h",1);
  std::ostream::operator<<(poVar2,local_3f0.horizon);
  if (local_940 != (code *)&local_930) {
    operator_delete(local_940,local_930 + 1);
  }
  if (local_5f0 != local_5e0) {
    operator_delete(local_5f0,local_5e0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_5f0,(char *)local_998,_S_out);
  if (((abStack_5d0[local_5f0[-3]] & 5) == 0) || (local_3f0.dryrun != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Computing ",10);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_940,local_938);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_940 != (code *)&local_930) {
      operator_delete(local_940,local_930 + 1);
    }
    PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_9d9);
    PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_9d9,0));
    local_9d2 = local_3f0.sparse != 0;
    BruteForceSearchPlanner::BruteForceSearchPlanner
              ((BruteForceSearchPlanner *)&local_940,(long)local_3f0.horizon,pDVar1,local_9d9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BruteForceSearchPlanner initialized",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    if (0 < local_3f0.nrRestarts) {
      iVar4 = local_3f0.nrRestarts;
      do {
        times(&local_9c8);
        BruteForceSearchPlanner::Plan();
        times(&local_978);
        local_9d0 = local_5f8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nvalue=",7);
        poVar2 = std::ostream::_M_insert<double>(local_9d0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if (local_3f0.dryrun == 0) {
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_5f0,local_3f0.horizon);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          sprintf(local_94a,"%.6f",local_9d0);
          sVar3 = strlen(local_94a);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5f0,local_94a,sVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5f0,"\t",1);
          poVar2 = std::ostream::_M_insert<long>((long)&local_5f0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          poVar2 = std::ostream::_M_insert<long>((long)&local_5f0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          local_9a8 = local_608;
          sStack_9a0.pi_ = sStack_600.pi_;
          if (sStack_600.pi_ != (sp_counted_base *)0x0) {
            LOCK();
            *(int *)(sStack_600.pi_ + 8) = *(int *)(sStack_600.pi_ + 8) + 1;
            UNLOCK();
          }
          JPolComponent_VectorImplementation::GetIndex();
          poVar2 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&local_5f0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          boost::detail::shared_count::~shared_count(&sStack_9a0);
          std::ostream::flush();
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    if ((local_3f0.dryrun == 0) && (local_3f0.outputPolicy == true)) {
      local_9c8.tms_utime = (clock_t)&local_9c8.tms_cutime;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_9c8,local_998,(long)local_998 + local_990);
      std::__cxx11::string::append((char *)&local_9c8);
      local_978.tms_utime = local_608;
      local_978.tms_stime = (clock_t)sStack_600.pi_;
      if (sStack_600.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        *(int *)(sStack_600.pi_ + 8) = *(int *)(sStack_600.pi_ + 8) + 1;
        UNLOCK();
      }
      local_9a8 = CONCAT44(local_9a8._4_4_,local_928);
      JPolComponent_VectorImplementation::ExportPolicyToFile
                ((string *)(local_608 + 0x38),(uint *)&local_9c8);
      boost::detail::shared_count::~shared_count((shared_count *)&local_978.tms_stime);
      if ((clock_t *)local_9c8.tms_utime != &local_9c8.tms_cutime) {
        operator_delete((void *)local_9c8.tms_utime,local_9c8.tms_cutime + 1);
      }
    }
    local_940 = BruteForceSearchPlanner::BruteForceSearchPlanner;
    local_918 = 0x107248;
    boost::detail::shared_count::~shared_count(&sStack_600);
    PlanningUnitMADPDiscrete::~PlanningUnitMADPDiscrete((PlanningUnitMADPDiscrete *)&local_940);
    PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_9d9);
    iVar4 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"BFS: could not open ",0x14);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_998,local_990);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    iVar4 = 1;
    std::ostream::flush();
  }
  local_5f0 = _VTT;
  *(undefined8 *)(local_5e8 + _VTT[-3] + -8) = _ExportPolicyToFile;
  std::filebuf::~filebuf(local_5e8);
  std::ios_base::~ios_base(local_4f8);
  if (local_998 != local_988) {
    operator_delete(local_998,local_988[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.maxplus_updateT._M_dataplus._M_p != &local_3f0.maxplus_updateT.field_2) {
    operator_delete(local_3f0.maxplus_updateT._M_dataplus._M_p,
                    local_3f0.maxplus_updateT.field_2._M_allocated_capacity + 1);
  }
  return iVar4;
}

Assistant:

int main(int argc, char **argv)
{
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);
    int restarts = args.nrRestarts;

    try {

    DecPOMDPDiscreteInterface* decpomdp =
        GetDecPOMDPDiscreteInterfaceFromArgs(args);

    stringstream ss;
    ss << directories::MADPGetResultsFilename("BFS",*decpomdp,args)
       << "h" << args.horizon;
    string filename=ss.str();
    ofstream of(filename.c_str());
    if(!of && !args.dryrun)
    {
        cerr << "BFS: could not open " << filename << endl;
        return(1);
    }

    cout << "Computing " << ss.str() << endl;
    
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);

    BruteForceSearchPlanner bfs(args.horizon, decpomdp, &params);

    cout << "BruteForceSearchPlanner initialized" << endl;


    for(int restartI = 0; restartI < restarts; restartI++)
    {
        tms ts_before, ts_after;
        clock_t ticks_before, ticks_after;
        ticks_before = times(&ts_before);

        bfs.Plan();

        ticks_after = times(&ts_after);
        clock_t ticks =  ticks_after - ticks_before;
        clock_t utime =   ts_after.tms_utime - ts_before.tms_utime;


        double V = bfs.GetExpectedReward();
        cout << "\nvalue="<< V << endl;
//        bfs.GetJointPolicyPureVector()->Print();

        if(! args.dryrun)
        {
            of << args.horizon<<"\t";
            char s[10];
            sprintf(s, "%.6f", V);
            of << s <<"\t";
            of << ticks <<"\t";
            of << utime <<"\t";
            of << bfs.GetJointPolicyPureVector()->GetIndex() <<"\n";
            of.flush();
        }
    }

    if(!args.dryrun && args.outputPolicy)
    {
        string outputFileName = filename + "_PolicyFile";
        bfs.GetJointPolicyPureVector()->ExportPolicyToFile(outputFileName, bfs.GetHorizon());
    }

    } catch(E& e){ e.Print(); }
}